

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativePreciseTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::precise_as_function_name
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *this;
  long lVar2;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"GL_EXT_gpu_shader5",(allocator<char> *)&local_68);
  bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_48);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
    std::__cxx11::string::~string((string *)&local_48);
    if (!bVar1) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,
                 "This test requires support for the extension GL_EXT_gpu_shader5 or context version 3.2 or higher."
                 ,
                 "ctx.isExtensionSupported(\"GL_EXT_gpu_shader5\") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativePreciseTests.cpp"
                 ,0xb2);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Test that precise cannot be used as a function name.",&local_69);
  NegativeTestContext::beginSection(ctx,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaderTypes + lVar2);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      generateAndVerifyShader(ctx,shaderType,TEST_PRECISE_AS_FUNCTION_NAME);
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void precise_as_function_name (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		ctx.isExtensionSupported("GL_EXT_gpu_shader5") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)),
		"This test requires support for the extension GL_EXT_gpu_shader5 or context version 3.2 or higher.");

	ctx.beginSection("Test that precise cannot be used as a function name.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_shaderTypes); ++ndx)
	{
		if (ctx.isShaderSupported(s_shaderTypes[ndx]))
			generateAndVerifyShader(ctx, s_shaderTypes[ndx], TEST_PRECISE_AS_FUNCTION_NAME);
	}
	ctx.endSection();
}